

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

HeapType __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,HeapType type)

{
  Random *this_00;
  uint32_t uVar1;
  BasicHeapType BVar2;
  iterator iVar3;
  value_type *pvVar4;
  FeatureOptions<wasm::HeapType> *pFVar5;
  HeapType HVar6;
  uintptr_t uVar7;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  local_58;
  key_type local_28;
  HeapType type_local;
  
  this_00 = &this->random;
  local_28.id = type.id;
  uVar1 = Random::upTo(this_00,3);
  if (uVar1 == 0) {
    return (HeapType)type.id;
  }
  if (((0xd < type.id) || (uVar1 = Random::upTo(this_00,2), uVar1 != 0)) || (10 < (uint)type.id)) {
    iVar3 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->interestingHeapSubTypes)._M_h,&local_28);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      return (HeapType)local_28.id;
    }
    if (*(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x10) ==
        *(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x18)) {
      return (HeapType)local_28.id;
    }
    pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this_00,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                ((long)iVar3.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                                       ._M_cur + 0x10));
    return (HeapType)pvVar4->id;
  }
  uVar7 = type.id & 0xffffffff;
  switch(uVar7) {
  case 0:
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add<>
                       ((FeatureOptions<wasm::HeapType> *)&local_58,(FeatureSet)0x100,(HeapType)0x0)
    ;
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar5,(FeatureSet)0x400,(HeapType)0xc);
    HVar6 = Random::pick<wasm::HeapType>(this_00,pFVar5);
    goto LAB_0012b22b;
  case 1:
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add<>
                       ((FeatureOptions<wasm::HeapType> *)&local_58,(FeatureSet)0x100,(HeapType)0x1)
    ;
    pFVar5 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar5,(FeatureSet)0x400,(HeapType)0xd);
    HVar6 = Random::pick<wasm::HeapType>(this_00,pFVar5);
LAB_0012b22b:
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree(&local_58);
    return (HeapType)HVar6.id;
  case 2:
    if ((*(uint *)(this->wasm + 0x108) >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd79,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((*(uint *)(this->wasm + 0x108) >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd7a,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    BVar2 = Random::
            pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this_00,any,eq,i31,struct_,array,none);
    goto LAB_0012b2ab;
  case 3:
    if ((*(uint *)(this->wasm + 0x108) >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd82,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((*(uint *)(this->wasm + 0x108) >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd83,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    BVar2 = Random::
            pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this_00,eq,i31,struct_,array,none);
    goto LAB_0012b2ab;
  case 4:
    BVar2 = i31;
    break;
  case 5:
    BVar2 = struct_;
    break;
  case 6:
    BVar2 = array;
    break;
  case 7:
    goto switchD_0012b148_caseD_7;
  default:
    wasm::handle_unreachable
              ("TODO: fuzz strings",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xd94);
  }
  BVar2 = Random::pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                    (this_00,BVar2,none);
LAB_0012b2ab:
  uVar7 = (uintptr_t)BVar2;
switchD_0012b148_caseD_7:
  return (HeapType)uVar7;
}

Assistant:

HeapType TranslateToFuzzReader::getSubType(HeapType type) {
  if (oneIn(3)) {
    return type;
  }
  if (type.isBasic() && oneIn(2)) {
    switch (type.getBasic()) {
      case HeapType::func:
        // TODO: Typed function references.
        return pick(FeatureOptions<HeapType>()
                      .add(FeatureSet::ReferenceTypes, HeapType::func)
                      .add(FeatureSet::GC, HeapType::nofunc));
      case HeapType::ext:
        return pick(FeatureOptions<HeapType>()
                      .add(FeatureSet::ReferenceTypes, HeapType::ext)
                      .add(FeatureSet::GC, HeapType::noext));
      case HeapType::any:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapType::any,
                    HeapType::eq,
                    HeapType::i31,
                    HeapType::struct_,
                    HeapType::array,
                    HeapType::none);
      case HeapType::eq:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapType::eq,
                    HeapType::i31,
                    HeapType::struct_,
                    HeapType::array,
                    HeapType::none);
      case HeapType::i31:
        return pick(HeapType::i31, HeapType::none);
      case HeapType::struct_:
        return pick(HeapType::struct_, HeapType::none);
      case HeapType::array:
        return pick(HeapType::array, HeapType::none);
      case HeapType::string:
        return HeapType::string;
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: fuzz strings");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
        break;
    }
  }
  // Look for an interesting subtype.
  auto iter = interestingHeapSubTypes.find(type);
  if (iter != interestingHeapSubTypes.end()) {
    auto& subTypes = iter->second;
    if (!subTypes.empty()) {
      return pick(subTypes);
    }
  }
  // Failure to do anything interesting, return the type.
  return type;
}